

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QByteArray>::insert
          (QMovableArrayOps<QByteArray> *this,qsizetype i,qsizetype n,parameter_type t)

{
  QByteArray **ppQVar1;
  qsizetype *pqVar2;
  QArrayData *data;
  char *pcVar3;
  qsizetype qVar4;
  long lVar5;
  QByteArray *pQVar6;
  qsizetype inserts;
  bool bVar7;
  
  data = &((t->d).d)->super_QArrayData;
  pcVar3 = (t->d).ptr;
  qVar4 = (t->d).size;
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  bVar7 = (this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.size != 0;
  QArrayDataPointer<QByteArray>::detachAndGrow
            ((QArrayDataPointer<QByteArray> *)this,(uint)(i == 0 && bVar7),n,(QByteArray **)0x0,
             (QArrayDataPointer<QByteArray> *)0x0);
  if (i == 0 && bVar7) {
    for (; n != 0; n = n + -1) {
      pQVar6 = (this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.ptr;
      pQVar6[-1].d.d = (Data *)data;
      pQVar6[-1].d.ptr = pcVar3;
      pQVar6[-1].d.size = qVar4;
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ppQVar1 = &(this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.size;
      *pqVar2 = *pqVar2 + 1;
    }
  }
  else {
    pQVar6 = (this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.ptr + i;
    memmove(pQVar6 + n,pQVar6,
            ((this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.size - i
            ) * 0x18);
    lVar5 = n;
    if (n != 0) {
      do {
        (pQVar6->d).d = (Data *)data;
        (pQVar6->d).ptr = pcVar3;
        (pQVar6->d).size = qVar4;
        if (data != (QArrayData *)0x0) {
          LOCK();
          (data->ref_)._q_value.super___atomic_base<int>._M_i =
               (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        lVar5 = lVar5 + -1;
        pQVar6 = pQVar6 + 1;
      } while (lVar5 != 0);
    }
    pqVar2 = &(this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.size;
    *pqVar2 = *pqVar2 + n;
  }
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,1,0x10);
      return;
    }
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }